

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrasterizer.cpp
# Opt level: O0

void __thiscall QScanConverter::scanConvert<false>(QScanConverter *this)

{
  int iVar1;
  qsizetype qVar2;
  Line *pLVar3;
  Line *pLVar4;
  Line **ppLVar5;
  QDataBuffer<QScanConverter::Line> *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  int j_1;
  int current;
  Line *node;
  int i_1;
  int winding;
  int x;
  int j;
  Line *l;
  int i;
  int numActive;
  int y;
  int line;
  anon_class_1_0_00000001 xOrder;
  anon_class_1_0_00000001 topOrder;
  Line *in_stack_ffffffffffffff48;
  QSpanBuffer *in_stack_ffffffffffffff50;
  Line *in_stack_ffffffffffffff58;
  QSpanBuffer *in_stack_ffffffffffffff60;
  bool local_91;
  int local_60;
  int local_50;
  uint local_4c;
  int local_44;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  anon_class_1_0_00000001 local_a;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = QDataBuffer<QScanConverter::Line>::size(in_RDI);
  if (qVar2 == 0) {
    QDataBuffer<QScanConverter::Line_*>::reset
              ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer);
  }
  else {
    local_9 = 0;
    local_a = (anon_class_1_0_00000001)0x0;
    pLVar3 = QDataBuffer<QScanConverter::Line>::data(in_RDI);
    pLVar4 = QDataBuffer<QScanConverter::Line>::data(in_RDI);
    qVar2 = QDataBuffer<QScanConverter::Line>::size(in_RDI);
    std::
    sort<QScanConverter::Line*,QScanConverter::scanConvert<false>()::_lambda(QScanConverter::Line_const&,QScanConverter::Line_const&)_1_>
              (pLVar3,pLVar4 + qVar2);
    local_28 = 0;
    pLVar3 = QDataBuffer<QScanConverter::Line>::first(in_RDI);
    for (local_2c = pLVar3->top; local_2c <= *(int *)((long)&in_RDI[1].siz + 4);
        local_2c = local_2c + 1) {
      while( true ) {
        qVar2 = QDataBuffer<QScanConverter::Line>::size(in_RDI);
        bVar6 = false;
        if (local_28 < qVar2) {
          pLVar3 = QDataBuffer<QScanConverter::Line>::at(in_RDI,(long)local_28);
          bVar6 = pLVar3->top == local_2c;
        }
        if (!bVar6) break;
        QDataBuffer<QScanConverter::Line>::at(in_RDI,(long)local_28);
        QDataBuffer<QScanConverter::Line_*>::operator<<
                  ((QDataBuffer<QScanConverter::Line_*> *)in_stack_ffffffffffffff50,
                   (Line **)in_stack_ffffffffffffff48);
        local_28 = local_28 + 1;
      }
      qVar2 = QDataBuffer<QScanConverter::Line_*>::size
                        ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer);
      local_30 = (int)qVar2;
      for (local_34 = 1; local_34 < local_30; local_34 = local_34 + 1) {
        ppLVar5 = QDataBuffer<QScanConverter::Line_*>::at
                            ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,(long)local_34
                            );
        in_stack_ffffffffffffff50 = (QSpanBuffer *)*ppLVar5;
        iVar1 = local_34;
        while( true ) {
          local_44 = iVar1 + -1;
          local_91 = false;
          if (-1 < local_44) {
            in_stack_ffffffffffffff60 = in_stack_ffffffffffffff50;
            ppLVar5 = QDataBuffer<QScanConverter::Line_*>::at
                                ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,
                                 (long)local_44);
            local_91 = scanConvert<false>::anon_class_1_0_00000001::operator()
                                 (&local_a,(Line *)in_stack_ffffffffffffff60,*ppLVar5);
          }
          if (local_91 == false) break;
          ppLVar5 = QDataBuffer<QScanConverter::Line_*>::at
                              ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,
                               (long)local_44);
          in_stack_ffffffffffffff58 = *ppLVar5;
          ppLVar5 = QDataBuffer<QScanConverter::Line_*>::at
                              ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,(long)iVar1)
          ;
          *ppLVar5 = in_stack_ffffffffffffff58;
          iVar1 = local_44;
        }
        ppLVar5 = QDataBuffer<QScanConverter::Line_*>::at
                            ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,(long)iVar1);
        *ppLVar5 = (Line *)in_stack_ffffffffffffff50;
      }
      local_4c = 0;
      for (local_50 = 0; local_50 < local_30; local_50 = local_50 + 1) {
        ppLVar5 = QDataBuffer<QScanConverter::Line_*>::at
                            ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,(long)local_50
                            );
        pLVar3 = *ppLVar5;
        if ((local_4c & (uint)in_RDI[2].siz) != 0) {
          QSpanBuffer::addSpan
                    (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                     (int)in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                     (int)in_stack_ffffffffffffff50);
        }
        local_4c = pLVar3->winding + local_4c;
        if (pLVar3->bottom == local_2c) {
          for (local_60 = local_50; local_60 < local_30 + -1; local_60 = local_60 + 1) {
            ppLVar5 = QDataBuffer<QScanConverter::Line_*>::at
                                ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,
                                 (long)(local_60 + 1));
            in_stack_ffffffffffffff48 = *ppLVar5;
            ppLVar5 = QDataBuffer<QScanConverter::Line_*>::at
                                ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,
                                 (long)local_60);
            *ppLVar5 = in_stack_ffffffffffffff48;
          }
          local_30 = local_30 + -1;
          QDataBuffer<QScanConverter::Line_*>::resize
                    ((QDataBuffer<QScanConverter::Line_*> *)in_stack_ffffffffffffff50,
                     (qsizetype)in_stack_ffffffffffffff48);
          local_50 = local_50 + -1;
        }
        else {
          pLVar3->x = pLVar3->delta + pLVar3->x;
        }
      }
    }
    QDataBuffer<QScanConverter::Line_*>::reset
              ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScanConverter::scanConvert()
{
    if (!m_lines.size()) {
        m_active.reset();
        return;
    }
    constexpr auto topOrder = [](const Line &a, const Line &b) {
        return a.top < b.top;
    };
    constexpr auto xOrder = [](const Line *a, const Line *b) {
        return a->x < b->x;
    };

    std::sort(m_lines.data(), m_lines.data() + m_lines.size(), topOrder);
    int line = 0;
    for (int y = m_lines.first().top; y <= m_bottom; ++y) {
        for (; line < m_lines.size() && m_lines.at(line).top == y; ++line) {
            // add node to active list
            if constexpr(AllVertical) {
                QScanConverter::Line *l = &m_lines.at(line);
                m_active.resize(m_active.size() + 1);
                int j;
                for (j = m_active.size() - 2; j >= 0 && xOrder(l, m_active.at(j)); --j)
                    m_active.at(j+1) = m_active.at(j);
                m_active.at(j+1) = l;
            } else {
                m_active << &m_lines.at(line);
            }
        }

        int numActive = m_active.size();
        if constexpr(!AllVertical) {
            // use insertion sort instead of std::sort, as the active edge list is quite small
            // and in the average case already sorted
            for (int i = 1; i < numActive; ++i) {
                QScanConverter::Line *l = m_active.at(i);
                int j;
                for (j = i-1; j >= 0 && xOrder(l, m_active.at(j)); --j)
                    m_active.at(j+1) = m_active.at(j);
                m_active.at(j+1) = l;
            }
        }

        int x = 0;
        int winding = 0;
        for (int i = 0; i < numActive; ++i) {
            QScanConverter::Line *node = m_active.at(i);

            const int current = QScFixedToInt(node->x);
            if (winding & m_fillRuleMask)
                m_spanBuffer->addSpan(x, current - x, y, 0xff);

            x = current;
            winding += node->winding;

            if (node->bottom == y) {
                // remove node from active list
                for (int j = i; j < numActive - 1; ++j)
                    m_active.at(j) = m_active.at(j+1);

                m_active.resize(--numActive);
                --i;
            } else {
                if constexpr(!AllVertical)
                    node->x += node->delta;
            }
        }
    }
    m_active.reset();
}